

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getObjectName(ObjFileParser *this)

{
  byte *pbVar1;
  Model *pMVar2;
  pointer ppOVar3;
  Object *pOVar4;
  size_t __n;
  bool bVar5;
  _Alloc_hider __s2;
  int iVar6;
  byte *pbVar7;
  pointer ppOVar8;
  byte *pbVar9;
  string strObjectName;
  string local_50;
  
  pbVar9 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar7 = pbVar1 + -1;
  bVar5 = pbVar7 == pbVar9 || pbVar9 == pbVar1;
  if (pbVar7 != pbVar9 && pbVar9 != pbVar1) {
    do {
      if (((ulong)*pbVar9 < 0x21) && ((0x100003601U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0)) {
        if (!bVar5) goto LAB_00478820;
        break;
      }
      pbVar9 = pbVar9 + 1;
      bVar5 = pbVar9 == pbVar7 || pbVar9 == pbVar1;
    } while (pbVar9 != pbVar7 && pbVar9 != pbVar1);
  }
  goto LAB_0047883a;
  while (pbVar9 != pbVar7) {
LAB_00478820:
    if (((*pbVar9 != 0x20) && (*pbVar9 != 9)) || (pbVar9 = pbVar9 + 1, pbVar9 == pbVar1)) break;
  }
LAB_0047883a:
  (this->m_DataIt)._M_current = (char *)pbVar9;
  if (pbVar9 != pbVar1) {
    pbVar7 = (byte *)(this->m_DataIt)._M_current;
    while ((pbVar7 != pbVar1 &&
           ((0x20 < (ulong)*pbVar7 || ((0x100003601U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))))) {
      pbVar7 = pbVar7 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar7;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50);
    __s2._M_p = local_50._M_dataplus._M_p;
    if (local_50._M_string_length != 0) {
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent =
           (Object *)0x0;
      pMVar2 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      ppOVar3 = *(pointer *)
                 ((long)&(pMVar2->m_Objects).
                         super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                 + 8);
      for (ppOVar8 = *(pointer *)
                      &(pMVar2->m_Objects).
                       super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                       ._M_impl; ppOVar8 != ppOVar3; ppOVar8 = ppOVar8 + 1) {
        pOVar4 = *ppOVar8;
        __n = (pOVar4->m_strObjName)._M_string_length;
        if ((__n == local_50._M_string_length) &&
           ((__n == 0 ||
            (iVar6 = bcmp((pOVar4->m_strObjName)._M_dataplus._M_p,__s2._M_p,__n), iVar6 == 0)))) {
          pMVar2->m_pCurrent = pOVar4;
          break;
        }
      }
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent ==
          (Object *)0x0) {
        createObject(this,&local_50);
      }
    }
    pbVar7 = (byte *)(this->m_DataIt)._M_current;
    pbVar9 = (byte *)(this->m_DataItEnd)._M_current;
    if (pbVar9 + -1 != pbVar7 && pbVar7 != pbVar9) {
      do {
        if (((*pbVar7 < 0xe) && ((0x3401U >> (*pbVar7 & 0x1f) & 1) != 0)) ||
           (pbVar7 = pbVar7 + 1, pbVar7 == pbVar9)) break;
      } while (pbVar7 != pbVar9 + -1);
    }
    pbVar1 = pbVar7;
    if (pbVar7 != pbVar9) {
      pbVar7 = pbVar7 + 1;
      this->m_uiLine = this->m_uiLine + 1;
      pbVar1 = pbVar7;
    }
    for (; (pbVar1 != pbVar9 && ((*pbVar1 == 0x20 || (pbVar7 = pbVar1, *pbVar1 == 9))));
        pbVar1 = pbVar1 + 1) {
      pbVar7 = pbVar9;
    }
    (this->m_DataIt)._M_current = (char *)pbVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ObjFileParser::getObjectName()
{
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }
    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }

    std::string strObjectName(pStart, &(*m_DataIt));
    if (!strObjectName.empty())
    {
        // Reset current object
        m_pModel->m_pCurrent = NULL;

        // Search for actual object
        for (std::vector<ObjFile::Object*>::const_iterator it = m_pModel->m_Objects.begin();
            it != m_pModel->m_Objects.end();
            ++it)
        {
            if ((*it)->m_strObjName == strObjectName)
            {
                m_pModel->m_pCurrent = *it;
                break;
            }
        }

        // Allocate a new object, if current one was not found before
        if( NULL == m_pModel->m_pCurrent ) {
            createObject( strObjectName );
        }
    }
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}